

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O1

Kit_DsdNtk_t * Kit_DsdDecomposeInt(uint *pTruth,int nVars,int nDecMux)

{
  undefined2 uVar1;
  Kit_DsdNtk_t *pNtk;
  Kit_DsdObj_t *pKVar2;
  undefined1 *puVar3;
  long lVar4;
  unsigned_short *pPar;
  uint uVar5;
  uint uVar6;
  int iVar7;
  
  if (0x10 < nVars) {
    __assert_fail("nVars <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                  ,0x8e1,"Kit_DsdNtk_t *Kit_DsdDecomposeInt(unsigned int *, int, int)");
  }
  pNtk = Kit_DsdNtkAlloc(nVars);
  uVar1 = pNtk->nVars;
  pNtk->Root = uVar1 * 2;
  pKVar2 = Kit_DsdObjAlloc(pNtk,KIT_DSD_PRIME,nVars);
  if (*pNtk->pNodes != pKVar2) {
    __assert_fail("pNtk->pNodes[0] == pObj",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                  ,0x8e6,"Kit_DsdNtk_t *Kit_DsdDecomposeInt(unsigned int *, int, int)");
  }
  if (0 < nVars) {
    lVar4 = 0;
    do {
      *(short *)(&pKVar2[1].field_0x0 + lVar4) = (short)lVar4;
      lVar4 = lVar4 + 2;
    } while ((ulong)(uint)nVars * 2 != lVar4);
  }
  puVar3 = (undefined1 *)0x0;
  if (((uint)*pKVar2 & 0x1c0) == 0x140) {
    puVar3 = &pKVar2[1].field_0x0 + ((uint)*pKVar2 >> 8 & 0x3fc);
  }
  uVar5 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar5 = 1;
  }
  if (0 < (int)uVar5) {
    lVar4 = (ulong)uVar5 + 1;
    do {
      *(uint *)(puVar3 + lVar4 * 4 + -8) = pTruth[lVar4 + -2];
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  uVar5 = Kit_TruthSupport(pTruth,nVars);
  uVar6 = (uVar5 >> 1 & 0x55555555) + (uVar5 & 0x55555555);
  uVar6 = (uVar6 >> 2 & 0x33333333) + (uVar6 & 0x33333333);
  uVar6 = (uVar6 >> 4 & 0x7070707) + (uVar6 & 0x7070707);
  uVar6 = (uVar6 >> 8 & 0xf000f) + (uVar6 & 0xf000f);
  iVar7 = (uVar6 >> 0x10) + (uVar6 & 0xffff);
  if (iVar7 == 1) {
    *pKVar2 = (Kit_DsdObj_t)((uint)*pKVar2 & 0x3fffe3f | 0x4000080);
    uVar6 = 0;
    do {
      if ((uVar5 >> (uVar6 & 0x1f) & 1) != 0) goto LAB_005cd065;
      uVar6 = uVar6 + 1;
    } while (uVar6 != 0x20);
    uVar6 = 0xffffffff;
LAB_005cd065:
    if ((int)uVar6 < 0) {
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
    *(ushort *)(pKVar2 + 1) = ((ushort)*pTruth & 1) + (short)uVar6 * 2;
  }
  else {
    pPar = &pNtk->Root;
    if (iVar7 == 0) {
      *pKVar2 = (Kit_DsdObj_t)((uint)*pKVar2 & 0x3fffe3f | 0x40);
      if (*pTruth == 0) {
        *(byte *)pPar = (byte)*pPar ^ 1;
      }
    }
    else {
      Kit_DsdDecompose_rec(pNtk,*pNtk->pNodes,uVar5,pPar,nDecMux);
    }
  }
  return pNtk;
}

Assistant:

Kit_DsdNtk_t * Kit_DsdDecomposeInt( unsigned * pTruth, int nVars, int nDecMux )
{
    Kit_DsdNtk_t * pNtk;
    Kit_DsdObj_t * pObj;
    unsigned uSupp;
    int i, nVarsReal;
    assert( nVars <= 16 );
    pNtk = Kit_DsdNtkAlloc( nVars );
    pNtk->Root = Abc_Var2Lit( pNtk->nVars, 0 );
    // create the first node
    pObj = Kit_DsdObjAlloc( pNtk, KIT_DSD_PRIME, nVars );
    assert( pNtk->pNodes[0] == pObj );
    for ( i = 0; i < nVars; i++ )
       pObj->pFans[i] = Abc_Var2Lit( i, 0 );
    Kit_TruthCopy( Kit_DsdObjTruth(pObj), pTruth, nVars );
    uSupp = Kit_TruthSupport( pTruth, nVars );
    // consider special cases
    nVarsReal = Kit_WordCountOnes( uSupp );
    if ( nVarsReal == 0 )
    {
        pObj->Type = KIT_DSD_CONST1;
        pObj->nFans = 0;
        if ( pTruth[0] == 0 )
             pNtk->Root = Abc_LitNot(pNtk->Root);
        return pNtk;
    }
    if ( nVarsReal == 1 )
    {
        pObj->Type = KIT_DSD_VAR;
        pObj->nFans = 1;
        pObj->pFans[0] = Abc_Var2Lit( Kit_WordFindFirstBit(uSupp), (pTruth[0] & 1) );
        return pNtk;
    }
    Kit_DsdDecompose_rec( pNtk, pNtk->pNodes[0], uSupp, &pNtk->Root, nDecMux );
    return pNtk;
}